

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIButton.cpp
# Opt level: O0

SColor __thiscall irr::gui::CGUIButton::getActiveColor(CGUIButton *this)

{
  byte bVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  long *in_RDI;
  IGUISkin *skin;
  u32 local_4;
  
  if ((*(byte *)(in_RDI + 0x4e) & 1) == 0) {
    puVar2 = (undefined8 *)(**(code **)(*(long *)in_RDI[0x25] + 0x60))();
    if (puVar2 == (undefined8 *)0x0) {
      local_4 = *(u32 *)((long)in_RDI + 0x274);
    }
    else if ((*(byte *)(in_RDI + 0x4e) & 1) == 0) {
      bVar1 = (**(code **)(*in_RDI + 0x90))();
      uVar3 = 9;
      if ((bVar1 & 1) != 0) {
        uVar3 = 8;
      }
      local_4 = (**(code **)*puVar2)(puVar2,uVar3);
    }
    else {
      local_4 = *(u32 *)((long)in_RDI + 0x274);
    }
  }
  else {
    local_4 = *(u32 *)((long)in_RDI + 0x274);
  }
  return (SColor)local_4;
}

Assistant:

irr::video::SColor CGUIButton::getActiveColor() const
{
	if (OverrideColorEnabled)
		return OverrideColor;
	IGUISkin *skin = Environment->getSkin();
	if (skin)
		return OverrideColorEnabled ? OverrideColor : skin->getColor(isEnabled() ? EGDC_BUTTON_TEXT : EGDC_GRAY_TEXT);
	return OverrideColor;
}